

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O2

void __thiscall
jsonnet::internal::CompilerPass::specs
          (CompilerPass *this,
          vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
          *specs)

{
  pointer pCVar1;
  pointer pCVar2;
  
  pCVar2 = (specs->
           super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pCVar1 = (specs->
           super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pCVar2 == pCVar1) {
      return;
    }
    (*this->_vptr_CompilerPass[1])(this,&pCVar2->openFodder);
    if (pCVar2->kind == IF) {
LAB_0016c6d5:
      (*this->_vptr_CompilerPass[6])(this,&pCVar2->expr);
    }
    else if (pCVar2->kind == FOR) {
      (*this->_vptr_CompilerPass[1])(this,&pCVar2->varFodder);
      (*this->_vptr_CompilerPass[1])(this,&pCVar2->inFodder);
      goto LAB_0016c6d5;
    }
    pCVar2 = pCVar2 + 1;
  } while( true );
}

Assistant:

void CompilerPass::specs(std::vector<ComprehensionSpec> &specs)
{
    for (auto &spec : specs) {
        fodder(spec.openFodder);
        switch (spec.kind) {
            case ComprehensionSpec::FOR:
                fodder(spec.varFodder);
                fodder(spec.inFodder);
                expr(spec.expr);
                break;
            case ComprehensionSpec::IF: expr(spec.expr); break;
        }
    }
}